

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiterable.h
# Opt level: O0

QConstIterator<QMetaAssociation> * __thiscall
QConstIterator<QMetaAssociation>::operator++(QConstIterator<QMetaAssociation> *this)

{
  long lVar1;
  QMetaContainer this_00;
  QBaseIterator<QMetaAssociation> *in_RDI;
  long in_FS_OFFSET;
  QBaseIterator<QMetaAssociation> *iterator;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iterator = in_RDI;
  this_00.d_ptr = (QMetaContainerInterface *)QBaseIterator<QMetaAssociation>::metaContainer(in_RDI);
  QBaseIterator<QMetaAssociation>::mutableIterator(in_RDI);
  QMetaContainer::advanceConstIterator((QMetaContainer *)this_00.d_ptr,iterator,(qsizetype)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QConstIterator<QMetaAssociation> *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QConstIterator &operator++()
    {
        this->metaContainer().advanceConstIterator(this->mutableIterator(), 1);
        return *this;
    }